

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void SplitPoly(FPolyNode *pnode,void *node,float *bbox)

{
  DVector2 DVar1;
  DVector2 DVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  FPolyNode *pFVar10;
  ulong uVar11;
  FPolySeg *item;
  DVector2 *pos;
  long lVar12;
  FPolySeg *pFVar13;
  float *bbox_00;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  float subbbox [4];
  
  if ((SplitPoly(FPolyNode*,void*,float*)::lists == '\0') &&
     (iVar7 = __cxa_guard_acquire(&SplitPoly(FPolyNode*,void*,float*)::lists), iVar7 != 0)) {
    SplitPoly::lists[1] = (TArray<FPolySeg,_FPolySeg>)ZEXT816(0);
    SplitPoly::lists[0] = (TArray<FPolySeg,_FPolySeg>)ZEXT816(0);
    __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
    __cxa_guard_release(&SplitPoly(FPolyNode*,void*,float*)::lists);
  }
  if (((ulong)node & 1) == 0) {
    iVar7 = R_PointOnSide(&(pnode->poly->CenterSpot).pos,(node_t *)node);
    TArray<FPolySeg,_FPolySeg>::Clear(SplitPoly::lists);
    TArray<FPolySeg,_FPolySeg>::Clear(SplitPoly::lists + 1);
    lVar12 = 0x10;
    for (uVar11 = 0; uVar11 < (pnode->segs).Count; uVar11 = uVar11 + 1) {
      pFVar13 = (pnode->segs).Array;
      item = (FPolySeg *)((long)pFVar13 + lVar12 + -0x10);
      pos = (DVector2 *)((long)&(pFVar13->v1).pos.X + lVar12);
      dVar3 = PartitionDistance((FPolyVertex *)item,(node_t *)node);
      dVar4 = PartitionDistance((FPolyVertex *)pos,(node_t *)node);
      if (dVar3 <= 0.3125) {
        iVar8 = iVar7;
        if (0.3125 < dVar4) {
          iVar8 = R_PointOnSide(pos,(node_t *)node);
        }
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar8,item);
      }
      else {
        iVar8 = R_PointOnSide((DVector2 *)item,(node_t *)node);
        if ((dVar4 <= 0.3125) || (iVar9 = R_PointOnSide(pos,(node_t *)node), iVar8 == iVar9)) {
          TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar8,item);
        }
        else {
          dVar4 = pos[-1].X;
          dVar6 = pos[-1].Y;
          dVar18 = pos->X - dVar4;
          dVar19 = pos->Y - dVar6;
          dVar3 = (double)(int)*(undefined8 *)((long)node + 8) * 1.52587890625e-05;
          dVar5 = (double)(int)((ulong)*(undefined8 *)((long)node + 8) >> 0x20) * 1.52587890625e-05;
          dVar17 = dVar5 * dVar18 - dVar3 * dVar19;
          if ((((dVar17 == 0.0) && (!NAN(dVar17))) ||
              (dVar17 = (dVar5 * ((double)*node * 1.52587890625e-05 - dVar4) +
                        dVar3 * (dVar6 - (double)*(int *)((long)node + 4) * 1.52587890625e-05)) /
                        dVar17, dVar17 < 0.0)) || (1.0 < dVar17)) {
            TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + iVar8,item);
          }
          else {
            TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists,item);
            TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + 1,item);
            dVar4 = dVar4 + dVar18 * dVar17;
            dVar6 = dVar6 + dVar19 * dVar17;
            uVar15 = SUB84(dVar6,0);
            uVar16 = (undefined4)((ulong)dVar6 >> 0x20);
            DVar1.Y._0_4_ = uVar15;
            DVar1.X = dVar4;
            DVar1.Y._4_4_ = uVar16;
            SplitPoly::lists[iVar8].Array[SplitPoly::lists[iVar8].Count - 1].v2.pos = DVar1;
            DVar2.Y._0_4_ = uVar15;
            DVar2.X = dVar4;
            DVar2.Y._4_4_ = uVar16;
            SplitPoly::lists[iVar9].Array[SplitPoly::lists[iVar9].Count - 1].v1.pos = DVar2;
          }
        }
      }
      lVar12 = lVar12 + 0x28;
    }
    if (SplitPoly::lists[1].Count == 0) {
      bbox_00 = (float *)((long)node + 0x10);
      SplitPoly(pnode,*(void **)((long)node + 0x38),bbox_00);
    }
    else {
      if (SplitPoly::lists[0].Count == 0) {
        SplitPoly(pnode,*(void **)((long)node + 0x40),(float *)((long)node + 0x20));
      }
      else {
        pFVar10 = NewPolyNode();
        pFVar10->poly = pnode->poly;
        TArray<FPolySeg,_FPolySeg>::operator=(&pFVar10->segs,SplitPoly::lists + 1);
        TArray<FPolySeg,_FPolySeg>::operator=(&pnode->segs,SplitPoly::lists);
        SplitPoly(pFVar10,*(void **)((long)node + 0x40),(float *)((long)node + 0x20));
        SplitPoly(pnode,*(void **)((long)node + 0x38),(float *)((long)node + 0x10));
        AddToBBox((float *)((long)node + 0x10),bbox);
      }
      bbox_00 = (float *)((long)node + 0x20);
    }
    AddToBBox(bbox_00,bbox);
    return;
  }
  pFVar10 = *(FPolyNode **)((long)node + 7);
  pnode->pnext = pFVar10;
  if (pFVar10 != (FPolyNode *)0x0) {
    if (pFVar10->state != 0x539) {
      __assert_fail("pnode->pnext->state == 1337",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x82a,"void SplitPoly(FPolyNode *, void *, float *)");
    }
    pFVar10->pprev = pnode;
  }
  pnode->pprev = (FPolyNode *)0x0;
  *(FPolyNode **)((long)node + 7) = pnode;
  pnode->snext = pnode->poly->subsectorlinks;
  pnode->poly->subsectorlinks = pnode;
  pnode->subsector = (subsector_t *)((long)node + -1);
  uVar11 = (ulong)(pnode->segs).Count;
  if (uVar11 == 0) {
    __assert_fail("pnode->segs.Size() != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                  ,0x836,"void SplitPoly(FPolyNode *, void *, float *)");
  }
  subbbox[0] = 1.1754944e-38;
  subbbox[1] = 3.4028235e+38;
  subbbox[2] = 3.4028235e+38;
  subbbox[3] = 1.1754944e-38;
  pFVar13 = (pnode->segs).Array;
  while (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
    AddToBBox(&pFVar13->v1,subbbox);
    AddToBBox(&pFVar13->v2,subbbox);
    pFVar13 = pFVar13 + 1;
  }
  AddToBBox(subbbox,bbox);
  return;
}

Assistant:

static void SplitPoly(FPolyNode *pnode, void *node, float bbox[4])
{
	static TArray<FPolySeg> lists[2];
	static const double POLY_EPSILON = 0.3125;

	if (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		int centerside = R_PointOnSide(pnode->poly->CenterSpot.pos, bsp);

		lists[0].Clear();
		lists[1].Clear();
		for(unsigned i=0;i<pnode->segs.Size(); i++)
		{
			FPolySeg *seg = &pnode->segs[i];

			// Parts of the following code were taken from Eternity and are
			// being used with permission.

			// get distance of vertices from partition line
			// If the distance is too small, we may decide to
			// change our idea of sidedness.
			double dist_v1 = PartitionDistance(&seg->v1, bsp);
			double dist_v2 = PartitionDistance(&seg->v2, bsp);

			// If the distances are less than epsilon, consider the points as being
			// on the same side as the polyobj origin. Why? People like to build
			// polyobject doors flush with their door tracks. This breaks using the
			// usual assumptions.
			

			// Addition to Eternity code: We must also check any seg with only one
			// vertex inside the epsilon threshold. If not, these lines will get split but
			// adjoining ones with both vertices inside the threshold won't thus messing up
			// the order in which they get drawn.

			if(dist_v1 <= POLY_EPSILON)
			{
				if (dist_v2 <= POLY_EPSILON)
				{
					lists[centerside].Push(*seg);
				}
				else
				{
					int side = R_PointOnSide(seg->v2.pos, bsp);
					lists[side].Push(*seg);
				}
			}
			else if (dist_v2 <= POLY_EPSILON)
			{
				int side = R_PointOnSide(seg->v1.pos, bsp);
				lists[side].Push(*seg);
			}
			else 
			{
				int side1 = R_PointOnSide(seg->v1.pos, bsp);
				int side2 = R_PointOnSide(seg->v2.pos, bsp);

				if(side1 != side2)
				{
					// if the partition line crosses this seg, we must split it.

					FPolyVertex vert;

					if (GetIntersection(seg, bsp, &vert))
					{
						lists[0].Push(*seg);
						lists[1].Push(*seg);
						lists[side1].Last().v2 = vert;
						lists[side2].Last().v1 = vert;
					}
					else
					{
						// should never happen
						lists[side1].Push(*seg);
					}
				}
				else 
				{
					// both points on the same side.
					lists[side1].Push(*seg);
				}
			}
		}
		if (lists[1].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);
			AddToBBox(bsp->bbox[0], bbox);
		}
		else if (lists[0].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[1], bsp->bbox[1]);
			AddToBBox(bsp->bbox[1], bbox);
		}
		else
		{
			// create the new node 
			FPolyNode *newnode = NewPolyNode();
			newnode->poly = pnode->poly;
			newnode->segs = lists[1];

			// set segs for original node
			pnode->segs = lists[0];
		
			// recurse back side
			SplitPoly(newnode, bsp->children[1], bsp->bbox[1]);
			
			// recurse front side
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);

			AddToBBox(bsp->bbox[0], bbox);
			AddToBBox(bsp->bbox[1], bbox);
		}
	}
	else
	{
		// we reached a subsector so we can link the node with this subsector
		subsector_t *sub = (subsector_t *)((BYTE *)node - 1);

		// Link node to subsector
		pnode->pnext = sub->polys;
		if (pnode->pnext != NULL) 
		{
			assert(pnode->pnext->state == 1337);
			pnode->pnext->pprev = pnode;
		}
		pnode->pprev = NULL;
		sub->polys = pnode;

		// link node to polyobject
		pnode->snext = pnode->poly->subsectorlinks;
		pnode->poly->subsectorlinks = pnode;
		pnode->subsector = sub;

		// calculate bounding box for this polynode
		assert(pnode->segs.Size() != 0);
		float subbbox[4] = { FLT_MIN, FLT_MAX, FLT_MAX, FLT_MIN };

		for (unsigned i = 0; i < pnode->segs.Size(); ++i)
		{
			AddToBBox(&pnode->segs[i].v1, subbbox);
			AddToBBox(&pnode->segs[i].v2, subbbox);
		}
		// Potentially expand the parent node's bounding box to contain these bits of polyobject.
		AddToBBox(subbbox, bbox);
	}
}